

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QLayout::replaceWidget(QLayout *this,QWidget *from,QWidget *to,FindChildOptions options)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  QLayoutItem *pQVar4;
  long *plVar5;
  QWidget *pQVar6;
  long lVar7;
  long *plVar8;
  QLayoutItem *this_00;
  int iVar9;
  QLayoutItem *local_40;
  
  pQVar4 = (QLayoutItem *)0x0;
  if (((from != to) && (from != (QWidget *)0x0)) && (to != (QWidget *)0x0)) {
    plVar1 = *(long **)&this->field_0x8;
    pQVar4 = (QLayoutItem *)(**(code **)(*(long *)this + 200))();
    bVar2 = true;
    iVar3 = -1;
    iVar9 = 0;
    if ((int)pQVar4 < 1) {
      plVar5 = (long *)0x0;
    }
    else {
      do {
        plVar5 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar9);
        if (plVar5 != (long *)0x0) {
          pQVar6 = (QWidget *)(**(code **)(*plVar5 + 0x68))(plVar5);
          iVar3 = iVar9;
          if (pQVar6 == from) goto LAB_002ec18e;
          lVar7 = (**(code **)(*plVar5 + 0x70))(plVar5);
          if (lVar7 != 0 &&
              ((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                     super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
            plVar8 = (long *)(**(code **)(*plVar5 + 0x70))(plVar5);
            pQVar4 = (QLayoutItem *)
                     (**(code **)(*plVar8 + 0xe0))
                               (plVar8,from,to,
                                options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                                super_QFlagsStorage<Qt::FindChildOption>.i);
            if (pQVar4 != (QLayoutItem *)0x0) {
              bVar2 = false;
              iVar3 = -1;
              goto LAB_002ec195;
            }
          }
        }
        iVar9 = iVar9 + 1;
        iVar3 = (**(code **)(*(long *)this + 200))(this);
      } while (iVar9 < iVar3);
      iVar3 = -1;
LAB_002ec18e:
      bVar2 = true;
      pQVar4 = local_40;
    }
LAB_002ec195:
    if (bVar2) {
      if (iVar3 == -1) {
        pQVar4 = (QLayoutItem *)0x0;
      }
      else {
        addChildWidget(this,to);
        this_00 = (QLayoutItem *)operator_new(0x18);
        (this_00->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
        this_00->_vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007f4ef8;
        this_00[1]._vptr_QLayoutItem = (_func_int **)to;
        QLayoutItem::setAlignment
                  (this_00,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                           ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(plVar5 + 1))->
                           super_QFlagsStorage<Qt::AlignmentFlag>);
        pQVar4 = (QLayoutItem *)(**(code **)(*plVar1 + 0x20))(plVar1,iVar3,this_00);
        if (pQVar4 == (QLayoutItem *)0x0) {
          (*this_00->_vptr_QLayoutItem[1])(this_00);
        }
      }
    }
  }
  return pQVar4;
}

Assistant:

QLayoutItem *QLayout::replaceWidget(QWidget *from, QWidget *to, Qt::FindChildOptions options)
{
    Q_D(QLayout);
    if (!from || !to)
        return nullptr;
    if (from == to)     // Do not return a QLayoutItem for \a from, since ownership still
        return nullptr; // belongs to the layout (since nothing was changed)

    int index = -1;
    QLayoutItem *item = nullptr;
    for (int u = 0; u < count(); ++u) {
        item = itemAt(u);
        if (!item)
            continue;

        if (item->widget() == from) {
            index = u;
            break;
        }

        if (item->layout() && (options & Qt::FindChildrenRecursively)) {
            QLayoutItem *r = item->layout()->replaceWidget(from, to, options);
            if (r)
                return r;
        }
    }
    if (index == -1)
        return nullptr;

    addChildWidget(to);
    QLayoutItem *newitem = new QWidgetItem(to);
    newitem->setAlignment(item->alignment());
    QLayoutItem *r = d->replaceAt(index, newitem);
    if (!r)
        delete newitem;
    return r;
}